

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

uint64_t float128_to_uint64_riscv32(float128 a,float_status *status)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar2 = a.high;
  uVar4 = a.low;
  uVar5 = a.high._6_2_ & 0x7fff;
  if (0x3ffe < uVar5 && (long)uVar2 < 0) {
    status->float_exception_flags = status->float_exception_flags | 1;
    return -(ulong)((((undefined1  [16])a & (undefined1  [16])0xffffffffffff) !=
                     (undefined1  [16])0x0 || uVar4 != 0) && (~uVar2 & 0x7fff000000000000) == 0);
  }
  uVar1 = (uVar2 & 0xffffffffffff) + 0x1000000000000;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
    uVar1 = uVar2 & 0xffffffffffff;
  }
  if (uVar5 < 0x402f) {
    if (uVar5 < 0x3ff0) {
      if (uVar5 == 0x3fef) {
        uVar6 = uVar1 | uVar4 != 0;
      }
      else {
        uVar6 = (ulong)(uVar1 != 0 || uVar4 != 0);
      }
      uVar1 = 0;
    }
    else {
      uVar6 = (ulong)(uVar4 != 0) | uVar1 << (a.high._6_1_ + 0x11U & 0x3f);
      uVar1 = uVar1 >> (0x2fU - (char)uVar5 & 0x3f);
    }
  }
  else {
    if (0x403e < uVar5) goto LAB_00c0ba8f;
    bVar3 = (byte)(uVar5 - 0x402f);
    uVar6 = uVar4 << (bVar3 & 0x3f);
    if (uVar5 - 0x402f != 0) {
      uVar1 = uVar1 << (bVar3 & 0x3f) | uVar4 >> (0x2fU - a.high._6_1_ & 0x3f);
    }
  }
  switch(status->float_rounding_mode) {
  case '\0':
  case '\x04':
    bVar3 = (byte)(uVar6 >> 0x3f);
    goto LAB_00c0ba85;
  case '\x01':
    bVar7 = (long)uVar2 < 0;
    break;
  case '\x02':
    bVar7 = -1 < (long)uVar2;
    break;
  case '\x03':
    bVar3 = 0;
    goto LAB_00c0ba85;
  case '\x05':
    bVar7 = (uVar1 & 1) == 0;
    break;
  default:
    abort();
  }
  bVar3 = uVar6 != 0 & bVar7;
LAB_00c0ba85:
  if (bVar3 != 0) {
    if (uVar1 + 1 == 0) {
LAB_00c0ba8f:
      status->float_exception_flags = status->float_exception_flags | 1;
      return 0xffffffffffffffff;
    }
    uVar1 = uVar1 + 1 &
            ~(ulong)((uVar6 & 0x7fffffffffffffff) == 0 && status->float_rounding_mode == '\0');
  }
  if (((long)uVar2 < 0) && (uVar1 != 0)) {
    status->float_exception_flags = status->float_exception_flags | 1;
    return 0;
  }
  if (uVar6 != 0) {
    status->float_exception_flags = status->float_exception_flags | 0x20;
  }
  return uVar1;
}

Assistant:

uint64_t float128_to_uint64(float128 a, float_status *status)
{
    flag aSign;
    int aExp;
    int shiftCount;
    uint64_t aSig0, aSig1;

    aSig0 = extractFloat128Frac0(a);
    aSig1 = extractFloat128Frac1(a);
    aExp = extractFloat128Exp(a);
    aSign = extractFloat128Sign(a);
    if (aSign && (aExp > 0x3FFE)) {
        float_raise(float_flag_invalid, status);
        if (float128_is_any_nan(a)) {
            return UINT64_MAX;
        } else {
            return 0;
        }
    }
    if (aExp) {
        aSig0 |= UINT64_C(0x0001000000000000);
    }
    shiftCount = 0x402F - aExp;
    if (shiftCount <= 0) {
        if (0x403E < aExp) {
            float_raise(float_flag_invalid, status);
            return UINT64_MAX;
        }
        shortShift128Left(aSig0, aSig1, -shiftCount, &aSig0, &aSig1);
    } else {
        shift64ExtraRightJamming(aSig0, aSig1, shiftCount, &aSig0, &aSig1);
    }
    return roundAndPackUint64(aSign, aSig0, aSig1, status);
}